

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void luaD_poscall(lua_State *L,CallInfo *ci,int nres)

{
  unsigned_short *puVar1;
  short sVar2;
  CallInfo *pCVar3;
  StkId pSVar4;
  lu_byte lVar5;
  uint uVar6;
  StkId level;
  ulong uVar7;
  lu_byte *plVar8;
  long lVar9;
  uint uVar10;
  TValue *io1;
  
  sVar2 = ci->nresults;
  if (-2 < sVar2 && L->hookmask != 0) {
    rethook(L,ci,nres);
  }
  level = (ci->func).p;
  uVar10 = nres;
  if (sVar2 != -1) {
    if (sVar2 == 1) {
      if (nres == 0) {
        lVar5 = '\0';
      }
      else {
        pSVar4 = (L->top).p;
        (level->val).value_ = pSVar4[-(long)nres].val.value_;
        lVar5 = *(lu_byte *)((long)pSVar4 + (long)nres * -0x10 + 8);
      }
      (level->val).tt_ = lVar5;
      level = level + 1;
      goto LAB_00108290;
    }
    if (sVar2 == 0) goto LAB_00108290;
    uVar10 = (int)sVar2;
    if (sVar2 < -1) {
      pCVar3 = L->ci;
      puVar1 = &pCVar3->callstatus;
      *puVar1 = *puVar1 | 0x200;
      (pCVar3->u2).funcidx = nres;
      level = luaF_close(L,level,-1,1);
      pCVar3 = L->ci;
      puVar1 = &pCVar3->callstatus;
      *puVar1 = *puVar1 & 0xfdff;
      if (L->hookmask != 0) {
        lVar9 = (L->stack).offset;
        rethook(L,pCVar3,nres);
        level = (StkId)(((long)level - lVar9) + (long)(L->stack).p);
      }
      uVar10 = -(int)sVar2 - 3;
      if (sVar2 == -2) {
        uVar10 = nres;
      }
    }
  }
  uVar6 = nres;
  if ((int)uVar10 < nres) {
    uVar6 = uVar10;
  }
  if ((int)uVar6 < 1) {
    uVar7 = 0;
  }
  else {
    pSVar4 = (L->top).p;
    lVar9 = 8;
    uVar7 = 0;
    do {
      *(undefined8 *)((long)level + lVar9 + -8) =
           *(undefined8 *)((long)pSVar4 + lVar9 + (long)nres * -0x10 + -8);
      *(undefined1 *)((long)level + lVar9) =
           *(undefined1 *)((long)pSVar4 + lVar9 + (long)nres * -0x10);
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar6 != uVar7);
  }
  if ((int)uVar7 < (int)uVar10) {
    lVar9 = (ulong)uVar10 - (uVar7 & 0xffffffff);
    plVar8 = &(&level->val)[uVar7 & 0xffffffff].tt_;
    do {
      *plVar8 = '\0';
      plVar8 = plVar8 + 0x10;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  level = level + (int)uVar10;
LAB_00108290:
  (L->top).p = level;
  L->ci = ci->previous;
  return;
}

Assistant:

void luaD_poscall (lua_State *L, CallInfo *ci, int nres) {
  int wanted = ci->nresults;
  if (l_unlikely(L->hookmask && !hastocloseCfunc(wanted)))
    rethook(L, ci, nres);
  /* move results to proper place */
  moveresults(L, ci->func.p, nres, wanted);
  /* function cannot be in any of these cases when returning */
  lua_assert(!(ci->callstatus &
        (CIST_HOOKED | CIST_YPCALL | CIST_FIN | CIST_TRAN | CIST_CLSRET)));
  L->ci = ci->previous;  /* back to caller (after closing variables) */
}